

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator!(Clifford *__return_storage_ptr__,Clifford *A)

{
  pointer *ppBVar1;
  uint tBase;
  iterator __position;
  uint uVar2;
  pointer pBVar3;
  float local_2c;
  Blade local_28;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (pBVar3 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    local_2c = 1.0;
    do {
      tBase = pBVar3->mBase;
      uVar2 = (tBase - ((tBase >> 3 & 0x1111111) +
                       (tBase >> 2 & 0x3333333) + (tBase >> 1 & 0x7777777))) +
              (tBase - ((tBase >> 3 & 0x11111111) +
                       (tBase >> 2 & 0x33333333) + (tBase >> 1 & 0x77777777)) >> 4) & 0xf0f0f0f;
      if (((uVar2 % 0xff + 1) * (uVar2 % 0xff) & 2) != 0) {
        local_2c = -1.0;
      }
      Blade::Blade(&local_28,tBase,pBVar3->mVal * local_2c);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                  (__return_storage_ptr__,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      Blade::~Blade(&local_28);
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator!(Clifford A)
{	float s=1;
	Clifford R;
	idx a=A.begin();
	while(a!=A.end())
	{	
		int r;
		r=bits(a->mBase);
		r=r*(r+1);
		if((r>>1)&1){s=-1;}
		R.push_back(Blade(a->mBase,s*a->mVal));
		a++;
	}
	return R;
}